

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

void __thiscall
cmCacheManager::CacheEntry::AppendProperty
          (CacheEntry *this,string *prop,string *value,bool asString)

{
  bool bVar1;
  CacheEntryType CVar2;
  ulong uVar3;
  allocator<char> local_49;
  string local_48;
  byte local_21;
  string *psStack_20;
  bool asString_local;
  string *value_local;
  string *prop_local;
  CacheEntry *this_local;
  
  local_21 = asString;
  psStack_20 = value;
  value_local = prop;
  prop_local = &this->Value;
  bVar1 = std::operator==(prop,"TYPE");
  if (bVar1) {
    uVar3 = std::__cxx11::string::empty();
    bVar1 = (uVar3 & 1) != 0;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"STRING",&local_49);
    }
    else {
      std::__cxx11::string::string((string *)&local_48,(string *)psStack_20);
    }
    CVar2 = cmState::StringToCacheEntryType(&local_48);
    this->Type = CVar2;
    std::__cxx11::string::~string((string *)&local_48);
    if (bVar1) {
      std::allocator<char>::~allocator(&local_49);
    }
  }
  else {
    bVar1 = std::operator==(value_local,"VALUE");
    if (bVar1) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        uVar3 = std::__cxx11::string::empty();
        if (((uVar3 & 1) == 0) && ((local_21 & 1) == 0)) {
          std::__cxx11::string::operator+=((string *)this,";");
        }
        std::__cxx11::string::operator+=((string *)this,(string *)psStack_20);
      }
    }
    else {
      cmPropertyMap::AppendProperty(&this->Properties,value_local,psStack_20,(bool)(local_21 & 1));
    }
  }
  return;
}

Assistant:

void cmCacheManager::CacheEntry::AppendProperty(const std::string& prop,
                                                const std::string& value,
                                                bool asString)
{
  if (prop == "TYPE") {
    this->Type =
      cmState::StringToCacheEntryType(!value.empty() ? value : "STRING");
  } else if (prop == "VALUE") {
    if (!value.empty()) {
      if (!this->Value.empty() && !asString) {
        this->Value += ";";
      }
      this->Value += value;
    }
  } else {
    this->Properties.AppendProperty(prop, value, asString);
  }
}